

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O1

TRef lj_opt_fwd_tab_len(jit_State *J)

{
  ushort uVar1;
  ushort uVar2;
  IRIns *pIVar3;
  ushort uVar4;
  uint uVar5;
  int iVar6;
  TRef TVar7;
  uint lim;
  ulong uVar8;
  
  uVar1 = (J->fold).ins.field_0.op1;
  uVar4 = J->chain[0x48];
  if (J->chain[0x48] <= uVar1) {
    uVar4 = uVar1;
  }
  uVar2 = J->chain[0x49];
  while (uVar5 = (uint)uVar2, lim = (uint)uVar4, uVar4 < uVar5) {
    pIVar3 = (J->cur).ir;
    uVar8 = (ulong)*(ushort *)((long)pIVar3 + (ulong)pIVar3[uVar5].field_0.op1 * 8 + 2);
    if (*(char *)((long)pIVar3 + uVar8 * 8 + 5) == '\x1e') {
      uVar8 = (ulong)pIVar3[uVar8].field_0.op1;
    }
    lim = uVar5;
    if ((*(byte *)((long)pIVar3 + uVar8 * 8 + 4) & 0x1f) == 0xe) break;
    uVar2 = *(ushort *)((long)pIVar3 + (ulong)uVar5 * 8 + 6);
  }
  iVar6 = fwd_aa_tab_clear(J,lim,(uint)uVar1);
  if (iVar6 != 0) {
    TVar7 = lj_opt_cselim(J,lim);
    return TVar7;
  }
  TVar7 = lj_ir_emit(J);
  return TVar7;
}

Assistant:

TRef LJ_FASTCALL lj_opt_fwd_tab_len(jit_State *J)
{
  IRRef tab = fins->op1;  /* Table reference. */
  IRRef lim = tab;  /* Search limit. */
  IRRef ref;

  /* Any ASTORE is a conflict and limits the search. */
  if (J->chain[IR_ASTORE] > lim) lim = J->chain[IR_ASTORE];

  /* Search for conflicting HSTORE with numeric key. */
  ref = J->chain[IR_HSTORE];
  while (ref > lim) {
    IRIns *store = IR(ref);
    IRIns *href = IR(store->op1);
    IRIns *key = IR(href->op2);
    if (irt_isnum(key->o == IR_KSLOT ? IR(key->op1)->t : key->t)) {
      lim = ref;  /* Conflicting store found, limits search for TLEN. */
      break;
    }
    ref = store->prev;
  }

  /* Search for aliasing table.clear. */
  if (!fwd_aa_tab_clear(J, lim, tab))
    return lj_ir_emit(J);

  /* Try to find a matching load. Below the conflicting store, if any. */
  return lj_opt_cselim(J, lim);
}